

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

void __thiscall
axl::sl::
OwningListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::mem::Delete<Point2d>_>
::clear(OwningListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::mem::Delete<Point2d>_>
        *this)

{
  Point2d *pPVar1;
  Point2d *pPVar2;
  
  pPVar2 = (this->
           super_ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
           ).super_ListData<Point2d>.m_head;
  if (pPVar2 != (Point2d *)0x0) {
    while (pPVar2 != (Point2d *)0x0) {
      pPVar1 = (Point2d *)(pPVar2->super_ListLink).m_next;
      operator_delete(pPVar2);
      pPVar2 = pPVar1;
    }
    (this->
    super_ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
    ).super_ListData<Point2d>.m_head = (Point2d *)0x0;
    (this->
    super_ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
    ).super_ListData<Point2d>.m_tail = (Point2d *)0x0;
    (this->
    super_ListBase<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>,_axl::sl::Iterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<Point2d,_axl::sl::ImplicitPtrCast<Point2d,_axl::sl::ListLink>_>_>
    ).super_ListData<Point2d>.m_count = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}